

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

ssize_t __thiscall phosg::read_abi_cxx11_(phosg *this,int __fd,void *__buf,size_t __nbytes)

{
  int __fd_00;
  char *__buf_00;
  void *__n;
  io_error *this_00;
  ssize_t ret_size;
  allocator<char> local_22;
  undefined1 local_21;
  void *local_20;
  size_t size_local;
  phosg *ppStack_10;
  int fd_local;
  string *data;
  
  local_21 = 0;
  local_20 = __buf;
  size_local._4_4_ = __fd;
  ppStack_10 = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)this,(size_type)__buf,'\0',&local_22);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_22);
  __fd_00 = size_local._4_4_;
  __buf_00 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  __n = (void *)::read(__fd_00,__buf_00,(size_t)local_20);
  if (-1 < (long)__n) {
    if (__n != local_20) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (size_type)__n);
    }
    return (ssize_t)this;
  }
  this_00 = (io_error *)__cxa_allocate_exception(0x20);
  io_error::io_error(this_00,size_local._4_4_);
  __cxa_throw(this_00,&io_error::typeinfo,io_error::~io_error);
}

Assistant:

string read(int fd, size_t size) {
  string data(size, '\0');
  ssize_t ret_size = ::read(fd, data.data(), size);
  if (ret_size < 0) {
    throw io_error(fd);
  } else if (ret_size != static_cast<ssize_t>(size)) {
    data.resize(ret_size);
  }
  return data;
}